

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_index.cpp
# Opt level: O0

void generateDataFile(char *data_file)

{
  ostream *poVar1;
  void *pvVar2;
  size_t sVar3;
  string local_2a8 [32];
  string local_288 [35];
  char local_265;
  int local_264;
  undefined8 local_260;
  uint64_t val_size;
  string local_250 [32];
  string local_230 [32];
  string local_210 [35];
  char local_1ed;
  int local_1ec;
  undefined8 local_1e8;
  uint64_t key_size;
  allocator local_1c9;
  string local_1c8 [36];
  int local_1a4;
  stringstream local_1a0 [4];
  int i;
  stringstream ss;
  ostream local_190 [376];
  FILE *local_18;
  FILE *f;
  char *data_file_local;
  
  f = (FILE *)data_file;
  local_18 = fopen(data_file,"wb");
  std::__cxx11::stringstream::stringstream(local_1a0);
  for (local_1a4 = 0; local_1a4 < 100000; local_1a4 = local_1a4 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c8,"",&local_1c9);
    std::__cxx11::stringstream::str((string *)local_1a0);
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    local_1e8 = 8;
    fwrite(&local_1e8,8,1,local_18);
    local_1ec = (int)std::setw((int)local_1e8);
    poVar1 = std::operator<<(local_190,(_Setw)local_1ec);
    local_1ed = (char)std::setfill<char>('0');
    poVar1 = std::operator<<(poVar1,local_1ed);
    std::ostream::operator<<(poVar1,local_1a4);
    std::__cxx11::stringstream::str();
    pvVar2 = (void *)std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    sVar3 = std::__cxx11::string::size();
    fwrite(pvVar2,sVar3,1,local_18);
    std::__cxx11::string::~string(local_230);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_250,"kv_value",(allocator *)((long)&val_size + 7));
    std::__cxx11::stringstream::str((string *)local_1a0);
    std::__cxx11::string::~string(local_250);
    std::allocator<char>::~allocator((allocator<char> *)((long)&val_size + 7));
    local_260 = 8;
    fwrite(&local_260,8,1,local_18);
    local_264 = (int)std::setw((int)local_260);
    poVar1 = std::operator<<(local_190,(_Setw)local_264);
    local_265 = (char)std::setfill<char>('0');
    poVar1 = std::operator<<(poVar1,local_265);
    std::ostream::operator<<(poVar1,local_1a4);
    std::__cxx11::stringstream::str();
    pvVar2 = (void *)std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    sVar3 = std::__cxx11::string::size();
    fwrite(pvVar2,sVar3,1,local_18);
    std::__cxx11::string::~string(local_2a8);
    std::__cxx11::string::~string(local_288);
  }
  fclose(local_18);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void generateDataFile(const char* data_file)
{
    FILE* f = fopen(data_file, "wb");

    stringstream ss;

    for (int i = 0; i < 100000; i++)
    {
        ss.str("");
        uint64_t key_size = 8;
        fwrite(&key_size, sizeof(key_size), 1, f);
        ss << setw(key_size) << setfill('0') << i;
        fwrite(ss.str().c_str(), ss.str().size(), 1, f);

        ss.str("kv_value");
        uint64_t val_size = 8;
        fwrite(&val_size, sizeof(val_size), 1, f);
        ss << setw(val_size) << setfill('0') << i;
        fwrite(ss.str().c_str(), ss.str().size(), 1, f);
    }

    fclose(f);
}